

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O3

int Abc_NodeAddClauses(sat_solver *pSat,char *pSop0,char *pSop1,Abc_Obj_t *pNode,Vec_Int_t *vVars)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  int local_48;
  
  iVar3 = (pNode->vFanins).nSize;
  iVar2 = Abc_SopGetVarNum(pSop0);
  if (iVar3 != iVar2) {
    __assert_fail("nFanins == Abc_SopGetVarNum( pSop0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                  ,0x2ac,
                  "int Abc_NodeAddClauses(sat_solver *, char *, char *, Abc_Obj_t *, Vec_Int_t *)");
  }
  pvVar1 = (pNode->field_5).pData;
  pDVar4 = Cudd_ReadOne((DdManager *)pNode->pNtk->pManFunc);
  if (pDVar4 == (DdNode *)((ulong)pvVar1 & 0xfffffffffffffffe)) {
    vVars->nSize = 0;
    Vec_IntPush(vVars,((pNode->field_5).iData & 1U) + pNode->Id * 2);
    iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
    local_48 = 1;
    if (iVar3 == 0) {
LAB_00309323:
      puts("The CNF is trivially UNSAT.");
      local_48 = 0;
    }
  }
  else {
    lVar5 = (long)(iVar3 + 3);
    if (*pSop0 != '\0') {
      lVar6 = 0;
      pcVar7 = pSop0;
      do {
        vVars->nSize = 0;
        if (0 < (pNode->vFanins).nSize) {
          lVar8 = 0;
          do {
            pvVar1 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]];
            if (pcVar7[lVar8] == '1') {
              iVar3 = *(int *)((long)pvVar1 + 0x10) * 2 + 1;
LAB_003091ca:
              Vec_IntPush(vVars,iVar3);
            }
            else if (pcVar7[lVar8] == '0') {
              iVar3 = *(int *)((long)pvVar1 + 0x10) * 2;
              goto LAB_003091ca;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (pNode->vFanins).nSize);
        }
        Vec_IntPush(vVars,pNode->Id * 2 + 1);
        iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
        if (iVar3 == 0) goto LAB_00309323;
        lVar6 = lVar6 + 1;
        pcVar7 = pcVar7 + lVar5;
      } while (pSop0[lVar6 * lVar5] != '\0');
    }
    local_48 = 1;
    if (*pSop1 != '\0') {
      lVar6 = 0;
      pcVar7 = pSop1;
      do {
        vVars->nSize = 0;
        if (0 < (pNode->vFanins).nSize) {
          lVar8 = 0;
          do {
            pvVar1 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]];
            if (pcVar7[lVar8] == '1') {
              iVar3 = *(int *)((long)pvVar1 + 0x10) * 2 + 1;
LAB_0030928b:
              Vec_IntPush(vVars,iVar3);
            }
            else if (pcVar7[lVar8] == '0') {
              iVar3 = *(int *)((long)pvVar1 + 0x10) * 2;
              goto LAB_0030928b;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (pNode->vFanins).nSize);
        }
        Vec_IntPush(vVars,pNode->Id * 2);
        iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
        if (iVar3 == 0) goto LAB_00309323;
        lVar6 = lVar6 + 1;
        pcVar7 = pcVar7 + lVar5;
      } while (pSop1[lVar6 * lVar5] != '\0');
    }
  }
  return local_48;
}

Assistant:

int Abc_NodeAddClauses( sat_solver * pSat, char * pSop0, char * pSop1, Abc_Obj_t * pNode, Vec_Int_t * vVars )
{
    Abc_Obj_t * pFanin;
    int i, c, nFanins;
    int RetValue = 0;
    char * pCube;

    nFanins = Abc_ObjFaninNum( pNode );
    assert( nFanins == Abc_SopGetVarNum( pSop0 ) );

//    if ( nFanins == 0 )
    if ( Cudd_Regular((Abc_Obj_t *)pNode->pData) == Cudd_ReadOne((DdManager *)pNode->pNtk->pManFunc) )
    {
        vVars->nSize = 0;
//        if ( Abc_SopIsConst1(pSop1) )
        if ( !Cudd_IsComplement(pNode->pData) )
            Vec_IntPush( vVars, toLit(pNode->Id) );
        else
            Vec_IntPush( vVars, lit_neg(toLit(pNode->Id)) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }
        return 1;
    }
 
    // add clauses for the negative phase
    for ( c = 0; ; c++ )
    {
        // get the cube
        pCube = pSop0 + c * (nFanins + 3);
        if ( *pCube == 0 )
            break;
        // add the clause
        vVars->nSize = 0;
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            if ( pCube[i] == '0' )
                Vec_IntPush( vVars, toLit(pFanin->Id) );
            else if ( pCube[i] == '1' )
                Vec_IntPush( vVars, lit_neg(toLit(pFanin->Id)) );
        }
        Vec_IntPush( vVars, lit_neg(toLit(pNode->Id)) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }
    }

    // add clauses for the positive phase
    for ( c = 0; ; c++ )
    {
        // get the cube
        pCube = pSop1 + c * (nFanins + 3);
        if ( *pCube == 0 )
            break;
        // add the clause
        vVars->nSize = 0;
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            if ( pCube[i] == '0' )
                Vec_IntPush( vVars, toLit(pFanin->Id) );
            else if ( pCube[i] == '1' )
                Vec_IntPush( vVars, lit_neg(toLit(pFanin->Id)) );
        }
        Vec_IntPush( vVars, toLit(pNode->Id) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }
    }
    return 1;
}